

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O0

void Js::JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
     ScriptToUtf8(ScriptContext *scriptContext,byte *script_,bool isUtf8,size_t length,
                 utf8char_t **utf8Script,size_t *utf8Length,size_t *scriptLength,
                 size_t *utf8AllocLength,bool heapAlloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  uchar *puVar5;
  Memory *this;
  size_t sVar6;
  ulong local_d0;
  TrackAllocData local_b8;
  code *local_90;
  undefined8 local_88;
  TrackAllocData local_80;
  ulong local_58;
  size_t cbUtf8Buffer;
  size_t script_length;
  WCHAR *script;
  size_t *psStack_38;
  bool heapAlloc_local;
  size_t *utf8Length_local;
  utf8char_t **utf8Script_local;
  size_t length_local;
  byte *pbStack_18;
  bool isUtf8_local;
  byte *script__local;
  ScriptContext *scriptContext_local;
  
  script._7_1_ = heapAlloc;
  if (isUtf8) {
    *utf8Script = script_;
    *utf8Length = length;
    *scriptLength = length;
    if (utf8AllocLength != (size_t *)0x0) {
      *utf8AllocLength = 0;
    }
  }
  else {
    script_length = (size_t)script_;
    psStack_38 = utf8Length;
    utf8Length_local = (size_t *)utf8Script;
    utf8Script_local = (utf8char_t **)length;
    length_local._7_1_ = isUtf8;
    pbStack_18 = script_;
    script__local = (byte *)scriptContext;
    if (utf8Script == (utf8char_t **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xae,"(utf8Script != nullptr)","utf8Script != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (psStack_38 == (size_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xaf,"(utf8Length != nullptr)","utf8Length != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (scriptLength == (size_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xb0,"(scriptLength != nullptr)","scriptLength != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *utf8Length_local = 0;
    *psStack_38 = 0;
    *scriptLength = 0;
    if (utf8AllocLength != (size_t *)0x0) {
      *utf8AllocLength = 0;
    }
    cbUtf8Buffer = PAL_wcslen((char16_t *)script_length);
    if (0xffffffff < cbUtf8Buffer) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    if (cbUtf8Buffer < 0x55555554) {
      local_d0 = (cbUtf8Buffer + 1) * 3;
    }
    else {
      local_d0 = 0xffffffff;
    }
    local_58 = local_d0;
    if (0xfffffffe < local_d0) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    if ((script._7_1_ & 1) == 0) {
      if (script__local == (byte *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                    ,0xcb,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar4 = ScriptContext::GetRecycler((ScriptContext *)script__local);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_80,(type_info *)&unsigned_char::typeinfo,0,local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                 ,0xcc);
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_80);
      local_90 = Memory::Recycler::AllocLeaf;
      local_88 = 0;
      puVar5 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                         ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,local_58);
      *utf8Length_local = (size_t)puVar5;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b8,(type_info *)&unsigned_char::typeinfo,0,local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                 ,0xd0);
      this = (Memory *)
             Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_b8);
      puVar5 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,false>
                         (this,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,local_58);
      *utf8Length_local = (size_t)puVar5;
    }
    sVar6 = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                      ((utf8char_t *)*utf8Length_local,local_58,(char16 *)script_length,
                       (charcount_t)cbUtf8Buffer);
    *psStack_38 = sVar6;
    *scriptLength = cbUtf8Buffer;
    if (utf8AllocLength != (size_t *)0x0) {
      *utf8AllocLength = local_58;
    }
  }
  return;
}

Assistant:

static void ScriptToUtf8(_When_(heapAlloc, _In_opt_) _When_(!heapAlloc, _In_) Js::ScriptContext *scriptContext,
            _In_z_ const byte *script_, bool isUtf8, size_t length, _Outptr_result_buffer_(*utf8Length) utf8char_t **utf8Script, _Out_ size_t *utf8Length,
            _Out_ size_t *scriptLength, _Out_opt_ size_t *utf8AllocLength, _In_ bool heapAlloc)
        {
            if (isUtf8)
            {
                *utf8Script = (utf8char_t*)script_;
                *utf8Length = length;
                *scriptLength = length; // xplat-todo: incorrect for utf8

                if (utf8AllocLength)
                {
                    *utf8AllocLength = 0;
                }
            }
            else
            {
                const WCHAR *script = (const WCHAR*) script_;
                Assert(utf8Script != nullptr);
                Assert(utf8Length != nullptr);
                Assert(scriptLength != nullptr);

                *utf8Script = nullptr;
                *utf8Length = 0;
                *scriptLength = 0;

                if (utf8AllocLength != nullptr)
                {
                    *utf8AllocLength = 0;
                }

                size_t script_length = wcslen(script);
                if (script_length > UINT_MAX)
                {
                    Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                }

                // `script_length` should not be bigger than MAXLONG
                // UINT_MAX / 3 < MAXLONG
                size_t cbUtf8Buffer = ((UINT_MAX / 3) - 1 > script_length) ? (script_length + 1) * 3 : UINT_MAX;
                if (cbUtf8Buffer >= UINT_MAX)
                {
                    Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                }

                if (!heapAlloc)
                {
                    Assert(scriptContext != nullptr);
                    *utf8Script = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), utf8char_t, cbUtf8Buffer);
                }
                else
                {
                    *utf8Script = HeapNewArray(utf8char_t, cbUtf8Buffer);
                }

                *utf8Length = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(*utf8Script, cbUtf8Buffer, script, static_cast<charcount_t>(script_length));
                *scriptLength = script_length;

                if (utf8AllocLength != nullptr)
                {
                    *utf8AllocLength = cbUtf8Buffer;
                }
            }
        }